

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O2

bool __thiscall DSaveMenu::Responder(DSaveMenu *this,event_t *ev)

{
  BYTE BVar1;
  short sVar2;
  uint uVar3;
  FSaveGameNode *pFVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  FBrokenLines *pFVar8;
  char *pcVar9;
  char *pcVar10;
  FName FStack_21c;
  FString aFStack_218 [65];
  
  if ((ev->subtype == '\x01') && (iVar7 = (this->super_DLoadSaveMenu).Selected, iVar7 != -1)) {
    sVar2 = ev->data1;
    if (sVar2 == 8) {
LAB_0032ea47:
      if (iVar7 == 0) {
        return true;
      }
      bVar6 = DLoadSaveMenu::Responder(&this->super_DLoadSaveMenu,ev);
      return bVar6;
    }
    if (sVar2 == 0x4e) {
      (this->super_DLoadSaveMenu).Selected = 0;
      (this->super_DLoadSaveMenu).TopItem = 0;
      DLoadSaveMenu::UnloadSaveData(&this->super_DLoadSaveMenu);
      return true;
    }
    if (sVar2 == 0x1a) goto LAB_0032ea47;
  }
  if (ev->type == '\x04') {
    BVar1 = ev->subtype;
    if (BVar1 == '\x11') {
      iVar7 = (this->super_DLoadSaveMenu).TopItem;
      if ((int)(DLoadSaveMenu::SaveGames.Count - (this->super_DLoadSaveMenu).listboxRows) <= iVar7)
      {
        return true;
      }
      iVar7 = iVar7 + 1;
    }
    else {
      if (BVar1 != '\x10') {
        if ((BVar1 == '\x01') &&
           (uVar3 = (this->super_DLoadSaveMenu).Selected, uVar3 < DLoadSaveMenu::SaveGames.Count)) {
          sVar2 = ev->data1;
          if ((sVar2 == 8) || (sVar2 == 0x1a)) {
            aFStack_218[0].Chars = FString::NullString.Nothing;
            FString::NullString.RefCount = FString::NullString.RefCount + 1;
            pcVar9 = FStringTable::operator()(&GStrings,"MNU_DELETESG");
            pFVar4 = DLoadSaveMenu::SaveGames.Array[(this->super_DLoadSaveMenu).Selected];
            pcVar10 = FStringTable::operator()(&GStrings,"PRESSYN");
            FString::Format(aFStack_218,"%s\x1cJ%s\x1c-?\n\n%s",pcVar9,pFVar4,pcVar10);
            FStack_21c.Index = 0;
            M_StartMessage(aFStack_218[0].Chars,0,&FStack_21c);
            FString::~FString(aFStack_218);
            return true;
          }
          if (sVar2 == 0xe) {
            if (*(int *)((DLoadSaveMenu::SaveGames.Array[(int)uVar3]->Filename).Chars + -0xc) == 0)
            {
              return true;
            }
            mysnprintf((char *)aFStack_218,0x200,"File on disk:\n%s");
            pFVar8 = (this->super_DLoadSaveMenu).SaveComment;
            if (pFVar8 != (FBrokenLines *)0x0) {
              V_FreeBrokenLines(pFVar8);
            }
            uVar5 = (long)((screen->super_DSimpleCanvas).super_DCanvas.Width * 0xd8) / 0x280;
            pFVar8 = V_BreakLines(SmallFont,
                                  (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 |
                                              uVar5 & 0xffffffff) / (long)CleanXfac),
                                  (BYTE *)aFStack_218,false);
            (this->super_DLoadSaveMenu).SaveComment = pFVar8;
            return true;
          }
        }
        goto LAB_0032e63a;
      }
      iVar7 = (this->super_DLoadSaveMenu).TopItem;
      if (iVar7 < 1) {
        return true;
      }
      iVar7 = iVar7 + -1;
    }
    (this->super_DLoadSaveMenu).TopItem = iVar7;
    return true;
  }
LAB_0032e63a:
  bVar6 = DListMenu::Responder((DListMenu *)this,ev);
  return bVar6;
}

Assistant:

bool DSaveMenu::Responder (event_t *ev)
{
	if (ev->subtype == EV_GUI_KeyDown)
	{
		if (Selected != -1)
		{
			switch (ev->data1)
			{
			case GK_DEL:
			case '\b':
				// cannot delete 'new save game' item
				if (Selected == 0) return true;
				break;

			case 'N':
				Selected = TopItem = 0;
				UnloadSaveData ();
				return true;
			}
		}
	}
	return Super::Responder(ev);
}